

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O2

_Bool do_zzi_sat(DisasContext_conflict1 *s,arg_rri_esz *a,_Bool u,_Bool d)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  TCGv_i64 val;
  _Bool _Var2;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  if ((a->esz == 0) && ((s->insn & 0x2000) != 0)) {
    _Var2 = false;
  }
  else {
    _Var1 = sve_access_check_aarch64(s);
    _Var2 = true;
    if (_Var1) {
      val = tcg_const_i64_aarch64(tcg_ctx,(long)a->imm);
      do_sat_addsub_vec(s,a->esz,a->rd,a->rn,val,u,d);
      tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(val + (long)tcg_ctx));
    }
  }
  return _Var2;
}

Assistant:

static bool do_zzi_sat(DisasContext *s, arg_rri_esz *a, bool u, bool d)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (a->esz == 0 && extract32(s->insn, 13, 1)) {
        return false;
    }
    if (sve_access_check(s)) {
        TCGv_i64 val = tcg_const_i64(tcg_ctx, a->imm);
        do_sat_addsub_vec(s, a->esz, a->rd, a->rn, val, u, d);
        tcg_temp_free_i64(tcg_ctx, val);
    }
    return true;
}